

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O1

void __thiscall
gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::freeAll
          (StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_> *this)

{
  long lVar1;
  
  if (this->dataptr != (FedInfo **)0x0) {
    if (0 < (long)this->dataSlotIndex) {
      operator_delete(this->dataptr[this->dataSlotIndex],0x200);
    }
    if (0 < (long)this->dataSlotIndex) {
      lVar1 = (long)this->dataSlotIndex + 1;
      do {
        operator_delete(this->dataptr[lVar1 + -2],0x200);
        lVar1 = lVar1 + -1;
      } while (1 < lVar1);
    }
    if (this->dataSlotIndex == 0) {
      operator_delete(*this->dataptr,0x200);
    }
    if (0 < this->freeIndex) {
      lVar1 = 0;
      do {
        operator_delete(this->freeblocks[lVar1],0x200);
        lVar1 = lVar1 + 1;
      } while (lVar1 < this->freeIndex);
    }
    if (this->freeblocks != (FedInfo **)0x0) {
      operator_delete__(this->freeblocks);
    }
    if (this->dataptr != (FedInfo **)0x0) {
      operator_delete__(this->dataptr);
      return;
    }
  }
  return;
}

Assistant:

void freeAll()
        {
            if (dataptr != nullptr) {
                Allocator a;
                for (int jj = bsize - 1; jj >= 0;
                     --jj) {  // call destructors on the last block
                    dataptr[dataSlotIndex][jj].~X();
                }
                if (dataSlotIndex > 0) {
                    a.deallocate(dataptr[dataSlotIndex], blockSize);
                }
                // go in reverse order
                for (int ii = dataSlotIndex - 1; ii >= 0; --ii) {
                    for (int jj = blockSize - 1; jj >= 0;
                         --jj) {  // call destructors on the middle blocks
                        dataptr[ii][jj].~X();
                    }
                    a.deallocate(dataptr[ii], blockSize);
                }
                if (dataSlotIndex == 0) {
                    a.deallocate(dataptr[0], blockSize);
                }

                for (int ii = 0; ii < freeIndex; ++ii) {
                    a.deallocate(freeblocks[ii], blockSize);
                }
                // delete can handle a nullptr
                delete[] freeblocks;
                delete[] dataptr;
            }
        }